

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Status XML_ParseBuffer(XML_Parser parser,int len,int isFinal)

{
  XML_Parsing XVar1;
  char *pcVar2;
  XML_Bool XVar3;
  XML_Error XVar4;
  char *pcVar5;
  XML_Status XVar6;
  
  XVar6 = XML_STATUS_ERROR;
  if (parser == (XML_Parser)0x0) {
    return XML_STATUS_ERROR;
  }
  XVar1 = (parser->m_parsingStatus).parsing;
  if (XVar1 == XML_INITIALIZED) {
    if ((parser->m_parentParser == (XML_Parser)0x0) && (XVar3 = startParsing(parser), XVar3 == '\0')
       ) {
      parser->m_errorCode = XML_ERROR_NO_MEMORY;
      return XML_STATUS_ERROR;
    }
  }
  else {
    if (XVar1 == XML_FINISHED) {
      parser->m_errorCode = XML_ERROR_FINISHED;
      return XML_STATUS_ERROR;
    }
    if (XVar1 == XML_SUSPENDED) {
      parser->m_errorCode = XML_ERROR_SUSPENDED;
      return XML_STATUS_ERROR;
    }
  }
  (parser->m_parsingStatus).parsing = XML_PARSING;
  pcVar2 = parser->m_bufferPtr;
  parser->m_positionPtr = pcVar2;
  pcVar5 = parser->m_bufferEnd + len;
  parser->m_bufferEnd = pcVar5;
  parser->m_parseEndPtr = pcVar5;
  parser->m_parseEndByteIndex = parser->m_parseEndByteIndex + (long)len;
  (parser->m_parsingStatus).finalBuffer = (XML_Bool)isFinal;
  XVar4 = (*parser->m_processor)(parser,pcVar2,pcVar5,&parser->m_bufferPtr);
  parser->m_errorCode = XVar4;
  if (XVar4 == XML_ERROR_NONE) {
    XVar1 = (parser->m_parsingStatus).parsing;
    XVar6 = XML_STATUS_OK;
    if (XVar1 < XML_FINISHED) {
      if (isFinal != 0) {
        (parser->m_parsingStatus).parsing = XML_FINISHED;
        return XML_STATUS_OK;
      }
    }
    else if (XVar1 == XML_SUSPENDED) {
      XVar6 = XML_STATUS_SUSPENDED;
    }
    (*parser->m_encoding->updatePosition)
              (parser->m_encoding,parser->m_positionPtr,parser->m_bufferPtr,&parser->m_position);
    parser->m_positionPtr = parser->m_bufferPtr;
  }
  else {
    parser->m_eventEndPtr = parser->m_eventPtr;
    parser->m_processor = errorProcessor;
  }
  return XVar6;
}

Assistant:

enum XML_Status XMLCALL
XML_ParseBuffer(XML_Parser parser, int len, int isFinal)
{
  const char *start;
  enum XML_Status result = XML_STATUS_OK;

  if (parser == NULL)
    return XML_STATUS_ERROR;
  switch (ps_parsing) {
  case XML_SUSPENDED:
    errorCode = XML_ERROR_SUSPENDED;
    return XML_STATUS_ERROR;
  case XML_FINISHED:
    errorCode = XML_ERROR_FINISHED;
    return XML_STATUS_ERROR;
  case XML_INITIALIZED:
    if (parentParser == NULL && !startParsing(parser)) {
      errorCode = XML_ERROR_NO_MEMORY;
      return XML_STATUS_ERROR;
    }
  default:
    ps_parsing = XML_PARSING;
  }

  start = bufferPtr;
  positionPtr = start;
  bufferEnd += len;
  parseEndPtr = bufferEnd;
  parseEndByteIndex += len;
  ps_finalBuffer = (XML_Bool)isFinal;

  errorCode = processor(parser, start, parseEndPtr, &bufferPtr);

  if (errorCode != XML_ERROR_NONE) {
    eventEndPtr = eventPtr;
    processor = errorProcessor;
    return XML_STATUS_ERROR;
  }
  else {
    switch (ps_parsing) {
    case XML_SUSPENDED:
      result = XML_STATUS_SUSPENDED;
      break;
    case XML_INITIALIZED:
    case XML_PARSING:
      if (isFinal) {
        ps_parsing = XML_FINISHED;
        return result;
      }
    default: ;  /* should not happen */
    }
  }

  XmlUpdatePosition(encoding, positionPtr, bufferPtr, &position);
  positionPtr = bufferPtr;
  return result;
}